

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int canrev(int x,int y,char (*board) [8],STATE s,int f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if (((uint)(y | x) < 8) && (iVar3 = 0, (board[x][y] & 0xfeU) != 4)) {
    iVar1 = IsChessAround(x,y,board,s == WHITE | WHITE);
    if (iVar1 != 0) {
      iVar3 = 0;
      for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
        iVar2 = revnum(x,y,iVar1,board,s,f);
        iVar3 = iVar3 + iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int canrev(int x, int y, char board[][SIZE], STATE s, int f) {
    int i, sum = 0;
    if (board[x][y] == WHITE || board[x][y] == BLACK) {
        return 0;
    }
    if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
        return 0;
    }
    STATE rs = (s == WHITE ? BLACK : WHITE);
    if (IsChessAround(x, y, board, rs)) {
        for (i = 0; i < 8; i++) {
            sum += revnum(x, y, i, board, s, f);
        }
    }
    return sum;
}